

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  curl_trc_feat *pcVar2;
  undefined8 *puVar3;
  _Bool _Var4;
  _Bool _Var5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  Cookie *co;
  char *pcVar9;
  char *__s;
  char *pcVar10;
  size_t sVar11;
  undefined8 *__base;
  Cookie *co_00;
  Cookie *pCVar12;
  size_t __nmemb;
  
  sVar7 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar7] != (Cookie *)0x0)) {
    remove_expired(c);
    _Var4 = Curl_host_is_ipnum(host);
    pCVar12 = c->cookies[sVar7];
    if (pCVar12 == (Cookie *)0x0) {
      __nmemb = 0;
      co = (Cookie *)0x0;
    }
    else {
      __nmemb = 0;
      co_00 = (Cookie *)0x0;
      do {
        co = co_00;
        if ((byte)(pCVar12->secure ^ 1U | secure) != 1) goto LAB_0011f7f1;
        pcVar9 = pCVar12->domain;
        if (pcVar9 != (char *)0x0) {
          if ((~pCVar12->tailmatch & 1U) == 0 && !_Var4) {
            sVar8 = strlen(pcVar9);
            _Var5 = cookie_tailmatch(pcVar9,sVar8,host);
            if (_Var5) goto LAB_0011f633;
          }
          if (((~pCVar12->tailmatch & 1U) == 0 && !_Var4) ||
             (iVar6 = curl_strequal(host,pCVar12->domain), iVar6 == 0)) goto LAB_0011f7f1;
        }
LAB_0011f633:
        pcVar9 = pCVar12->spath;
        if ((pcVar9 == (char *)0x0) || (sVar8 = strlen(pcVar9), sVar8 == 1)) goto LAB_0011f64e;
        __s = (*Curl_cstrdup)(path);
        if (__s != (char *)0x0) {
          pcVar10 = strchr(__s,0x3f);
          if (pcVar10 != (char *)0x0) {
            *pcVar10 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (char *)Curl_memdup0("/",1);
            if (__s == (char *)0x0) goto LAB_0011f7f1;
          }
          sVar11 = strlen(__s);
          if ((sVar11 < sVar8) || (iVar6 = strncmp(pcVar9,__s,sVar8), iVar6 != 0)) {
            (*Curl_cfree)(__s);
          }
          else {
            if (sVar8 == sVar11) {
              (*Curl_cfree)(__s);
            }
            else {
              cVar1 = __s[sVar8];
              (*Curl_cfree)(__s);
              if (cVar1 != '/') goto LAB_0011f7f1;
            }
LAB_0011f64e:
            co = (Cookie *)(*Curl_ccalloc)(1,0x48);
            if (co != (Cookie *)0x0) {
              if (pCVar12->domain == (char *)0x0) {
LAB_0011f68d:
                if (pCVar12->path != (char *)0x0) {
                  pcVar9 = (*Curl_cstrdup)(pCVar12->path);
                  co->path = pcVar9;
                  if (pcVar9 == (char *)0x0) goto LAB_0011f734;
                }
                if (pCVar12->spath != (char *)0x0) {
                  pcVar9 = (*Curl_cstrdup)(pCVar12->spath);
                  co->spath = pcVar9;
                  if (pcVar9 == (char *)0x0) goto LAB_0011f734;
                }
                if (pCVar12->name != (char *)0x0) {
                  pcVar9 = (*Curl_cstrdup)(pCVar12->name);
                  co->name = pcVar9;
                  if (pcVar9 == (char *)0x0) goto LAB_0011f734;
                }
                if (pCVar12->value != (char *)0x0) {
                  pcVar9 = (*Curl_cstrdup)(pCVar12->value);
                  co->value = pcVar9;
                  if (pcVar9 == (char *)0x0) goto LAB_0011f734;
                }
                co->expires = pCVar12->expires;
                co->tailmatch = pCVar12->tailmatch;
                co->secure = pCVar12->secure;
                co->livecookie = pCVar12->livecookie;
                co->httponly = pCVar12->httponly;
                co->creationtime = pCVar12->creationtime;
              }
              else {
                pcVar9 = (*Curl_cstrdup)(pCVar12->domain);
                co->domain = pcVar9;
                if (pcVar9 != (char *)0x0) goto LAB_0011f68d;
LAB_0011f734:
                freecookie(co);
                co = (Cookie *)0x0;
              }
            }
            if (co == (Cookie *)0x0) goto joined_r0x0011f90f;
            co->next = co_00;
            __nmemb = __nmemb + 1;
            if (0x95 < __nmemb) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar2->log_level)))) {
                Curl_infof(data,"Included max number of cookies (%zu) in request!",__nmemb);
              }
              break;
            }
          }
        }
LAB_0011f7f1:
        pCVar12 = pCVar12->next;
        co_00 = co;
      } while (pCVar12 != (Cookie *)0x0);
    }
    if (__nmemb == 0) {
      return co;
    }
    __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
    puVar3 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; co != (Cookie *)0x0; co = co->next) {
        *puVar3 = co;
        puVar3 = puVar3 + 1;
      }
      qsort(__base,__nmemb,8,cookie_sort);
      co = (Cookie *)*__base;
      if (__nmemb != 1) {
        sVar8 = 1;
        do {
          *(undefined8 *)__base[sVar8 - 1] = __base[sVar8];
          sVar8 = sVar8 + 1;
        } while (__nmemb != sVar8);
      }
      *(undefined8 *)__base[__nmemb - 1] = 0;
      (*Curl_cfree)(__base);
    }
    co_00 = co;
    if (__base != (undefined8 *)0x0) {
      return co;
    }
joined_r0x0011f90f:
    while (co_00 != (Cookie *)0x0) {
      pCVar12 = co_00->next;
      freecookie(co_00);
      co_00 = pCVar12;
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we are secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}